

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::internalGetCEs
          (RuleBasedCollator *this,UnicodeString *str,UVector64 *ces,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *s_00;
  int64_t iVar3;
  int64_t ce_1;
  FCDUTF16CollationIterator iter_1;
  int64_t ce;
  UTF16CollationIterator iter;
  UBool numeric;
  UChar *limit;
  UChar *s;
  UErrorCode *errorCode_local;
  UVector64 *ces_local;
  UnicodeString *str_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    s_00 = UnicodeString::getBuffer(str);
    iVar2 = UnicodeString::length(str);
    iter.limit._7_1_ = CollationSettings::isNumeric(this->settings);
    UVar1 = CollationSettings::dontCheckFCD(this->settings);
    if (UVar1 == '\0') {
      FCDUTF16CollationIterator::FCDUTF16CollationIterator
                ((FCDUTF16CollationIterator *)&ce_1,this->data,iter.limit._7_1_,s_00,s_00,
                 s_00 + iVar2);
      while (iVar3 = CollationIterator::nextCE((CollationIterator *)&ce_1,errorCode),
            iVar3 != 0x101000100) {
        UVector64::addElement(ces,iVar3,errorCode);
      }
      FCDUTF16CollationIterator::~FCDUTF16CollationIterator((FCDUTF16CollationIterator *)&ce_1);
    }
    else {
      UTF16CollationIterator::UTF16CollationIterator
                ((UTF16CollationIterator *)&ce,this->data,iter.limit._7_1_,s_00,s_00,s_00 + iVar2);
      while (iVar3 = CollationIterator::nextCE((CollationIterator *)&ce,errorCode),
            iVar3 != 0x101000100) {
        UVector64::addElement(ces,iVar3,errorCode);
      }
      UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)&ce);
    }
  }
  return;
}

Assistant:

void
RuleBasedCollator::internalGetCEs(const UnicodeString &str, UVector64 &ces,
                                  UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return; }
    const UChar *s = str.getBuffer();
    const UChar *limit = s + str.length();
    UBool numeric = settings->isNumeric();
    if(settings->dontCheckFCD()) {
        UTF16CollationIterator iter(data, numeric, s, s, limit);
        int64_t ce;
        while((ce = iter.nextCE(errorCode)) != Collation::NO_CE) {
            ces.addElement(ce, errorCode);
        }
    } else {
        FCDUTF16CollationIterator iter(data, numeric, s, s, limit);
        int64_t ce;
        while((ce = iter.nextCE(errorCode)) != Collation::NO_CE) {
            ces.addElement(ce, errorCode);
        }
    }
}